

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O0

token_t __thiscall ConfigReader::tokenize(ConfigReader *this,string *tokstr)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  bool local_2b;
  byte local_29;
  string *tokstr_local;
  ConfigReader *this_local;
  
  std::__cxx11::string::clear();
  while( true ) {
    bVar1 = isWhitespace(this,this->m_tokchar);
    local_29 = 0;
    if (bVar1) {
      local_29 = std::ios::eof();
      local_29 = local_29 ^ 0xff;
    }
    if ((local_29 & 1) == 0) break;
    cVar2 = std::istream::get();
    this->m_tokchar = cVar2;
  }
  uVar4 = std::ios::eof();
  if ((uVar4 & 1) == 0) {
    if ((this->m_tokchar == '\n') || (this->m_tokchar == '\r')) {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      this->m_lineNum = this->m_lineNum + 1;
      this_local._4_4_ = TOK_EOL;
    }
    else if (this->m_tokchar == '#') {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      this_local._4_4_ = TOK_HASH;
    }
    else if (this->m_tokchar == ';') {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      this_local._4_4_ = TOK_SEMICOL;
    }
    else if (this->m_tokchar == '(') {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      this_local._4_4_ = TOK_LPAREN;
    }
    else if (this->m_tokchar == ')') {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      this_local._4_4_ = TOK_RPAREN;
    }
    else if (this->m_tokchar == '[') {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      this_local._4_4_ = TOK_LBRACKET;
    }
    else if (this->m_tokchar == ']') {
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      this_local._4_4_ = TOK_RBRACKET;
    }
    else if (this->m_tokchar == '-') {
      std::__cxx11::string::operator=((string *)tokstr,this->m_tokchar);
      cVar2 = std::istream::get();
      this->m_tokchar = cVar2;
      bVar1 = isDigit(this,this->m_tokchar);
      if (bVar1) {
        while( true ) {
          bVar3 = isDigit(this,this->m_tokchar);
          bVar1 = true;
          if ((!bVar3) && (bVar1 = true, this->m_tokchar != '.')) {
            bVar1 = this->m_tokchar == 'e';
          }
          if (!bVar1) break;
          std::__cxx11::string::operator+=((string *)tokstr,this->m_tokchar);
          cVar2 = std::istream::get();
          this->m_tokchar = cVar2;
        }
        this_local._4_4_ = TOK_NUMBER;
      }
      else {
        this_local._4_4_ = TOK_MINUS;
      }
    }
    else {
      bVar1 = isAlpha(this,this->m_tokchar);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)tokstr,this->m_tokchar);
        cVar2 = std::istream::get();
        this->m_tokchar = cVar2;
        while( true ) {
          bVar1 = isAlphaNumeric(this,this->m_tokchar);
          local_2b = true;
          if (!bVar1) {
            local_2b = isSpecialIdentChar(this,this->m_tokchar);
          }
          if (local_2b == false) break;
          std::__cxx11::string::operator+=((string *)tokstr,this->m_tokchar);
          cVar2 = std::istream::get();
          this->m_tokchar = cVar2;
        }
        this_local._4_4_ = TOK_IDENT;
      }
      else if (this->m_tokchar == '\"') {
        cVar2 = std::istream::get();
        this->m_tokchar = cVar2;
        while( true ) {
          bVar1 = false;
          if ((this->m_tokchar != '\"') && (bVar1 = false, this->m_tokchar != '\n')) {
            bVar1 = this->m_tokchar != '\r';
          }
          if (!bVar1) break;
          std::__cxx11::string::operator+=((string *)tokstr,this->m_tokchar);
          cVar2 = std::istream::get();
          this->m_tokchar = cVar2;
        }
        if (this->m_tokchar == '\"') {
          cVar2 = std::istream::get();
          this->m_tokchar = cVar2;
        }
        this_local._4_4_ = TOK_STRING;
      }
      else {
        bVar1 = isDigit(this,this->m_tokchar);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)tokstr,this->m_tokchar);
          cVar2 = std::istream::get();
          this->m_tokchar = cVar2;
          while( true ) {
            bVar3 = isDigit(this,this->m_tokchar);
            bVar1 = true;
            if ((!bVar3) && (bVar1 = true, this->m_tokchar != '.')) {
              bVar1 = this->m_tokchar == 'e';
            }
            if (!bVar1) break;
            std::__cxx11::string::operator+=((string *)tokstr,this->m_tokchar);
            cVar2 = std::istream::get();
            this->m_tokchar = cVar2;
          }
          this_local._4_4_ = TOK_NUMBER;
        }
        else {
          cVar2 = std::istream::get();
          this->m_tokchar = cVar2;
          this_local._4_4_ = TOK_ERR;
        }
      }
    }
  }
  else {
    this_local._4_4_ = TOK_EOF;
  }
  return this_local._4_4_;
}

Assistant:

ConfigReader::token_t ConfigReader::tokenize(std::string &tokstr)
{
    tokstr.clear();

    while(isWhitespace(m_tokchar) && !m_is->eof())
    {
        m_tokchar = m_is->get();
    }

    if (m_is->eof())
    {
        return TOK_EOF;
    }

    if ((m_tokchar==10) || (m_tokchar==13))
    {
        m_tokchar = m_is->get();
        m_lineNum++;
        return TOK_EOL;
    }

    if (m_tokchar=='#')
    {
        m_tokchar = m_is->get();
        return TOK_HASH; 
    }

    if (m_tokchar==';')
    {
        m_tokchar = m_is->get();
        return TOK_SEMICOL; 
    }

    if (m_tokchar=='(')
    {
        m_tokchar = m_is->get();
        return TOK_LPAREN;
    }

    if (m_tokchar==')')
    {
        m_tokchar = m_is->get();
        return TOK_RPAREN;
    }

    if (m_tokchar=='[')
    {
        m_tokchar = m_is->get();
        return TOK_LBRACKET;
    }

    if (m_tokchar==']')
    {
        m_tokchar = m_is->get();
        return TOK_RBRACKET;
    }

    if (m_tokchar=='-')
    {
        // could be the start of a number
        tokstr = m_tokchar;
        m_tokchar = m_is->get();
        if (isDigit(m_tokchar))
        {
            // it is indeed a number!
            while(isDigit(m_tokchar) || (m_tokchar == '.') || (m_tokchar == 'e'))
            {
                tokstr += m_tokchar;
                m_tokchar = m_is->get();
            }
            return TOK_NUMBER;            
        }
        return TOK_MINUS;
    }

    if (isAlpha(m_tokchar))
    {
        tokstr = m_tokchar;
        m_tokchar = m_is->get();
        while(isAlphaNumeric(m_tokchar) || isSpecialIdentChar(m_tokchar))
        {            
            tokstr += m_tokchar;
            m_tokchar = m_is->get();
        }
        return TOK_IDENT;
    }

    if (m_tokchar=='"')
    {
        m_tokchar = m_is->get();
        while((m_tokchar != '"') && (m_tokchar != 10) && (m_tokchar != 13))
        {
            tokstr += m_tokchar;
            m_tokchar = m_is->get();
        }

        // skip closing quotes
        if (m_tokchar == '"')
        {
            m_tokchar = m_is->get();
        }

        // error on newline
        if ((m_tokchar == 10) || (m_tokchar == 13))
        {
            // TODO: error, string cannot continue after newline!
        }
        return TOK_STRING;
    }

    if (isDigit(m_tokchar))
    {
        tokstr = m_tokchar;
        m_tokchar = m_is->get();
        while(isDigit(m_tokchar) || (m_tokchar == '.') || (m_tokchar == 'e'))
        {
            tokstr += m_tokchar;
            m_tokchar = m_is->get();
        }
        return TOK_NUMBER;
    }

    m_tokchar = m_is->get();
    return TOK_ERR;
}